

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

int acmod_set_mfcfh(acmod_t *acmod,FILE *logfh)

{
  uint in_EAX;
  ulong uStack_18;
  int rv;
  
  uStack_18 = (ulong)in_EAX;
  if ((FILE *)acmod->mfcfh != (FILE *)0x0) {
    fclose((FILE *)acmod->mfcfh);
  }
  acmod->mfcfh = logfh;
  fwrite(&rv,4,1,(FILE *)logfh);
  return rv;
}

Assistant:

int
acmod_set_mfcfh(acmod_t *acmod, FILE *logfh)
{
    int rv = 0;

    if (acmod->mfcfh)
        fclose(acmod->mfcfh);
    acmod->mfcfh = logfh;
    fwrite(&rv, 4, 1, acmod->mfcfh);
    return rv;
}